

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed.c++
# Opt level: O2

void __thiscall capnp::_::PackedInputStream::skip(PackedInputStream *this,size_t bytes)

{
  ArrayPtr<const_unsigned_char> AVar1;
  size_t sVar2;
  int iVar3;
  byte bVar4;
  byte *pbVar5;
  uchar *puVar6;
  ulong uVar7;
  uchar *puVar8;
  uint uVar9;
  bool bVar10;
  ArrayPtr<const_unsigned_char> AVar11;
  size_t bytes_local;
  uint runLength;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Fault f;
  
  if (bytes == 0) {
    return;
  }
  bytes_local = bytes;
  AVar11 = kj::BufferedInputStream::getReadBuffer(this->inner);
LAB_0018cf25:
  AVar1.size_ = _kjCondition.left;
  AVar1.ptr = AVar11.ptr;
  do {
    _kjCondition.left = AVar1.size_;
    pbVar5 = AVar1.ptr;
    if ((ulong)((long)(AVar11.ptr + AVar11.size_) - (long)pbVar5) < 10) {
      if (AVar11.ptr + AVar11.size_ == pbVar5) {
        (*(this->inner->super_InputStream)._vptr_InputStream[3])(this->inner,AVar11.size_);
        AVar11 = kj::BufferedInputStream::getReadBuffer(this->inner);
        _kjCondition.left = AVar11.size_;
        _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
        _kjCondition.op.content.ptr = " > ";
        _kjCondition.op.content.size_ = 4;
        _kjCondition.result = _kjCondition.left != 0;
        if (!_kjCondition.result) {
          iVar3 = 0xd0;
LAB_0018d1d9:
          _kjCondition.left = 0;
          _kjCondition.op.content.size_ = 4;
          _kjCondition.op.content.ptr = " > ";
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[31]>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                     ,iVar3,FAILED,"buffer.size() > 0",
                     "_kjCondition,\"Premature end of packed input.\"",&_kjCondition,
                     (char (*) [31])"Premature end of packed input.");
          goto LAB_0018d1e3;
        }
        goto LAB_0018cf25;
      }
      bVar4 = *pbVar5;
      pbVar5 = pbVar5 + 1;
      uVar9 = 0;
      while( true ) {
        AVar1.size_ = _kjCondition.left;
        AVar1.ptr = pbVar5;
        sVar2 = AVar11.size_;
        if (uVar9 == 8) break;
        if ((bVar4 >> (uVar9 & 0x1f) & 1) != 0) {
          if (AVar11.ptr + sVar2 == pbVar5) {
            (*(this->inner->super_InputStream)._vptr_InputStream[3])(this->inner,sVar2);
            AVar11 = kj::BufferedInputStream::getReadBuffer(this->inner);
            _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
            _kjCondition.op.content.ptr = " > ";
            _kjCondition.op.content.size_ = 4;
            bVar10 = AVar11.size_ == 0;
            _kjCondition.result = !bVar10;
            AVar1 = AVar11;
            if (bVar10) {
              iVar3 = 0xdc;
              goto LAB_0018d1d9;
            }
          }
          _kjCondition.left = AVar1.size_;
          pbVar5 = AVar1.ptr + 1;
        }
        uVar9 = uVar9 + 1;
      }
      bytes_local = bytes_local - 8;
      if ((AVar11.ptr + sVar2 == pbVar5) && ((byte)(bVar4 + 1) < 2)) {
        (*(this->inner->super_InputStream)._vptr_InputStream[3])(this->inner,sVar2);
        AVar11 = kj::BufferedInputStream::getReadBuffer(this->inner);
        _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
        _kjCondition.op.content.ptr = " > ";
        _kjCondition.op.content.size_ = 4;
        _kjCondition.result = AVar11.size_ != 0;
        AVar1 = AVar11;
        if (!_kjCondition.result) {
          iVar3 = 0xe4;
          goto LAB_0018d1d9;
        }
      }
    }
    else {
      bVar4 = *pbVar5;
      AVar1.size_ = _kjCondition.left;
      AVar1.ptr = pbVar5 + (ulong)(bVar4 >> 7) +
                           (ulong)((bVar4 >> 6 & 1) != 0) +
                           (ulong)(bVar4 >> 5 & 1) +
                           (ulong)((bVar4 >> 4 & 1) != 0) +
                           (ulong)(bVar4 >> 3 & 1) +
                           (ulong)((bVar4 >> 2 & 1) != 0) +
                           (ulong)(bVar4 >> 1 & 1) + (ulong)(bVar4 & 1) + 1;
      bytes_local = bytes_local - 8;
    }
    pbVar5 = AVar1.ptr;
    _kjCondition.left = (unsigned_long)&runLength;
    if (bVar4 == 0) {
      uVar7 = (ulong)*pbVar5 * 8;
      runLength = (uint)uVar7;
      _kjCondition.op.content.ptr = " <= ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = bytes_local >= uVar7;
      if (bytes_local < uVar7) {
        iVar3 = 0xfe;
LAB_0018d269:
        _kjCondition.op.content.size_ = 5;
        _kjCondition.op.content.ptr = " <= ";
        _kjCondition._8_8_ = &bytes_local;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_long&>&,char_const(&)[56]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                   ,iVar3,FAILED,"runLength <= bytes",
                   "_kjCondition,\"Packed input did not end cleanly on a segment boundary.\"",
                   (DebugComparison<unsigned_int_&,_unsigned_long_&> *)&_kjCondition,
                   (char (*) [56])"Packed input did not end cleanly on a segment boundary.");
LAB_0018d1e3:
        kj::_::Debug::Fault::~Fault(&f);
        return;
      }
      AVar1.size_ = (size_t)&runLength;
      AVar1.ptr = pbVar5 + 1;
      bytes_local = bytes_local + (ulong)*pbVar5 * -8;
      _kjCondition._8_8_ = &bytes_local;
    }
    else if (bVar4 == 0xff) {
      puVar8 = (uchar *)((ulong)*pbVar5 * 8);
      runLength = (uint)puVar8;
      _kjCondition.op.content.ptr = " <= ";
      _kjCondition.op.content.size_ = 5;
      sVar2 = bytes_local + (ulong)*pbVar5 * -8;
      _kjCondition.result = bytes_local >= puVar8;
      if (bytes_local < puVar8) {
        iVar3 = 0x109;
        goto LAB_0018d269;
      }
      puVar6 = AVar11.ptr + (AVar11.size_ - (long)(pbVar5 + 1));
      bytes_local = sVar2;
      if (puVar6 <= puVar8) break;
      AVar1.size_ = (size_t)&runLength;
      AVar1.ptr = pbVar5 + 1 + (long)puVar8;
      _kjCondition._8_8_ = &bytes_local;
    }
    _kjCondition.left = AVar1.size_;
    if (bytes_local == 0) {
      (*(this->inner->super_InputStream)._vptr_InputStream[3])
                (this->inner,(long)AVar1.ptr - (long)AVar11.ptr);
      return;
    }
  } while( true );
  runLength = runLength - (int)puVar6;
  _kjCondition._8_8_ = &bytes_local;
  (*(this->inner->super_InputStream)._vptr_InputStream[3])
            (this->inner,AVar11.size_ + (ulong)runLength);
  if (bytes_local == 0) {
    return;
  }
  AVar11 = kj::BufferedInputStream::getReadBuffer(this->inner);
  goto LAB_0018cf25;
}

Assistant:

void PackedInputStream::skip(size_t bytes) {
  // We can't just read into buffers because buffers must end on block boundaries.

  if (bytes == 0) {
    return;
  }

  KJ_DREQUIRE(bytes % sizeof(word) == 0, "PackedInputStream reads must be word-aligned.");

  kj::ArrayPtr<const byte> buffer = inner.getReadBuffer();
  const uint8_t* __restrict__ in = reinterpret_cast<const uint8_t*>(buffer.begin());

#define REFRESH_BUFFER() \
  inner.skip(buffer.size()); \
  buffer = inner.getReadBuffer(); \
  KJ_REQUIRE(buffer.size() > 0, "Premature end of packed input.") { return; } \
  in = reinterpret_cast<const uint8_t*>(buffer.begin())

  for (;;) {
    uint8_t tag;

    if (BUFFER_REMAINING < 10) {
      if (BUFFER_REMAINING == 0) {
        REFRESH_BUFFER();
        continue;
      }

      // We have at least 1, but not 10, bytes available.  We need to read slowly, doing a bounds
      // check on each byte.

      tag = *in++;

      for (uint i = 0; i < 8; i++) {
        if (tag & (1u << i)) {
          if (BUFFER_REMAINING == 0) {
            REFRESH_BUFFER();
          }
          in++;
        }
      }
      bytes -= 8;

      if (BUFFER_REMAINING == 0 && (tag == 0 || tag == 0xffu)) {
        REFRESH_BUFFER();
      }
    } else {
      tag = *in++;

#define HANDLE_BYTE(n) \
      in += (tag & (1u << n)) != 0

      HANDLE_BYTE(0);
      HANDLE_BYTE(1);
      HANDLE_BYTE(2);
      HANDLE_BYTE(3);
      HANDLE_BYTE(4);
      HANDLE_BYTE(5);
      HANDLE_BYTE(6);
      HANDLE_BYTE(7);
#undef HANDLE_BYTE

      bytes -= 8;
    }

    if (tag == 0) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= bytes, "Packed input did not end cleanly on a segment boundary.") {
        return;
      }

      bytes -= runLength;

    } else if (tag == 0xffu) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= bytes, "Packed input did not end cleanly on a segment boundary.") {
        return;
      }

      bytes -= runLength;

      size_t inRemaining = BUFFER_REMAINING;
      if (inRemaining > runLength) {
        // Fast path.
        in += runLength;
      } else {
        // Forward skip to the underlying stream.
        runLength -= inRemaining;
        inner.skip(buffer.size() + runLength);

        if (bytes == 0) {
          return;
        } else {
          buffer = inner.getReadBuffer();
          in = reinterpret_cast<const uint8_t*>(buffer.begin());

          // Skip the bounds check below since we just did the same check above.
          continue;
        }
      }
    }

    if (bytes == 0) {
      inner.skip(in - reinterpret_cast<const uint8_t*>(buffer.begin()));
      return;
    }
  }

  KJ_FAIL_ASSERT("Can't get here.");
}